

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

Metric * __thiscall
hta::Directory::make_metric
          (Metric *__return_storage_ptr__,Directory *this,string *name,json *config)

{
  undefined4 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference this_00;
  runtime_error *this_01;
  pointer pDVar4;
  undefined8 in_R9;
  Meta local_110;
  unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_> local_f8;
  undefined1 local_ea;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_71;
  key_type local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mode_str;
  Mode mode;
  json *config_local;
  string *name_local;
  Directory *this_local;
  
  mode_str.field_2._12_4_ = 2;
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[5]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [5])"mode");
  if (sVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"mode",&local_71);
    this_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::at(config,&local_70);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,this_00
              );
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"RW");
    if (bVar2) {
      mode_str.field_2._12_4_ = 2;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"R");
      if (bVar2) {
        mode_str.field_2._12_4_ = 0;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,"W");
        if (!bVar2) {
          local_ea = 1;
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"unknown metric mode ",&local_e9);
          std::operator+(&local_c8,&local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::operator+(&local_a8,&local_c8," supported modes are RW,R,W");
          std::runtime_error::runtime_error(this_01,(string *)&local_a8);
          local_ea = 0;
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        mode_str.field_2._12_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  pDVar4 = std::unique_ptr<hta::storage::Directory,_std::default_delete<hta::storage::Directory>_>::
           operator->(&this->directory_);
  uVar1 = mode_str.field_2._12_4_;
  Meta::Meta(&local_110,config);
  (**pDVar4->_vptr_Directory)
            (&local_f8,pDVar4,name,(ulong)(uint)uVar1,local_110.interval_factor,in_R9,
             (undefined4)local_110.interval_min.__r,(undefined4)local_110.interval_max.__r,
             local_110.interval_factor);
  Metric::Metric(__return_storage_ptr__,&local_f8);
  std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::~unique_ptr
            (&local_f8);
  return __return_storage_ptr__;
}

Assistant:

Metric Directory::make_metric(const std::string& name, const hta::json& config)
{
    Mode mode = Mode::read_write;
    if (config.count("mode"))
    {
        auto mode_str = config.at("mode").get<std::string>();
        if (mode_str == "RW")
        {
            mode = Mode::read_write;
        }
        else if (mode_str == "R")
        {
            mode = Mode::read;
        }
        else if (mode_str == "W")
        {
            mode = Mode::write;
        }
        else
        {
            throw std::runtime_error(std::string("unknown metric mode ") + mode_str +
                                     " supported modes are RW,R,W");
        }
    }
    return Metric(directory_->open(name, mode, Meta(config)));
}